

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.h
# Opt level: O0

void __thiscall
mip_converter_test::MIPInstanceBackend::SetLinearObjective
          (MIPInstanceBackend *this,int param_2,LinearObjective *lo)

{
  LinearObjective *in_RDX;
  SparseVec *in_RDI;
  SparseVec lin_part;
  LinearObjective *in_stack_fffffffffffffed8;
  value_type *__x;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef8;
  SparseVec *in_stack_ffffffffffffff00;
  
  mp::LinearObjective::coefs(in_stack_fffffffffffffed8);
  mp::ArrayRef::operator_cast_to_vector((ArrayRef<double> *)in_stack_fffffffffffffed8);
  mp::LinearObjective::vars(in_stack_fffffffffffffed8);
  mp::ArrayRef::operator_cast_to_vector((ArrayRef<int> *)in_stack_fffffffffffffed8);
  MIPInstance::SparseVec::SparseVec
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  mp::ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x3d639e);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  mp::ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x3d63b8);
  __x = (value_type *)
        &(in_RDI->c_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  mp::LinearObjective::obj_sense(in_RDX);
  MIPInstance::SparseVec::SparseVec(in_RDI,(SparseVec *)__x);
  std::
  vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
  ::push_back((vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
               *)in_RDI,__x);
  MIPInstance::Objective::~Objective((Objective *)0x3d6402);
  MIPInstance::SparseVec::~SparseVec(in_RDI);
  return;
}

Assistant:

void SetLinearObjective(int , const mp::LinearObjective& lo) {
    mip_converter_test::MIPInstance::SparseVec lin_part {lo.coefs(), lo.vars()};
    instance_.objs_.push_back({(Sense)lo.obj_sense(),
                              std::move(lin_part)});
  }